

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_mov_z(DisasContext_conflict1 *s,int rd,int rn)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    tcg_gen_gvec_mov_aarch64(tcg_ctx,0,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,s->sve_len,s->sve_len);
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool do_mov_z(DisasContext *s, int rd, int rn)
{
    return do_vector2_z(s, tcg_gen_gvec_mov, 0, rd, rn);
}